

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,true,false>
               (uchar *ldata,uchar *rdata,uchar *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  uchar uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uchar lentry;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar1 = *ldata;
      iVar6 = 0;
      do {
        result_data[iVar6] = rdata[iVar6] * uVar1;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar7 = 0;
    do {
      uVar3 = puVar2[uVar7];
      uVar8 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar8 = count;
      }
      uVar4 = uVar8;
      if (uVar3 != 0) {
        uVar4 = uVar5;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar5 < uVar8) {
            uVar1 = *ldata;
            do {
              result_data[uVar5] = rdata[uVar5] * uVar1;
              uVar5 = uVar5 + 1;
              uVar4 = uVar8;
            } while (uVar8 != uVar5);
          }
        }
        else if (uVar5 < uVar8) {
          uVar9 = 0;
          do {
            if ((uVar3 >> (uVar9 & 0x3f) & 1) != 0) {
              result_data[uVar9 + uVar5] = rdata[uVar9 + uVar5] * *ldata;
            }
            uVar9 = uVar9 + 1;
            uVar4 = uVar8;
          } while (uVar8 - uVar5 != uVar9);
        }
      }
      uVar5 = uVar4;
      uVar7 = uVar7 + 1;
    } while (uVar7 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}